

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void readDHT(FILE *f)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  pair<unsigned_char,_unsigned_int> *__k;
  byte *pbVar4;
  ulong uVar5;
  char *__format;
  int i;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  uchar v_1;
  uchar v [1];
  uchar a [16];
  byte local_6e;
  byte local_6d;
  int local_6c;
  pair<unsigned_char,_unsigned_int> *local_68;
  FILE *local_60;
  ulong local_58;
  ulong local_50;
  byte local_48 [24];
  
  uVar3 = EnterNewSection(f,"DHT");
  for (local_6c = uVar3 - 2; local_6c != 0; local_6c = (local_6c - uVar3) + -0x11) {
    local_60 = (FILE *)f;
    fread(&local_6d,1,1,(FILE *)f);
    bVar1 = local_6d;
    uVar8 = (ulong)local_6d;
    __format = "AC\n";
    if (uVar8 < 0x10) {
      __format = "DC\n";
    }
    printf(__format);
    local_58 = (ulong)(bVar1 & 0xf);
    local_50 = uVar8;
    printf(anon_var_dwarf_2e6b + 9);
    fread(local_48,1,0x10,(FILE *)f);
    lVar6 = 0;
    uVar3 = 0;
    do {
      bVar1 = local_48[lVar6];
      printf("%d ",(ulong)bVar1);
      uVar3 = uVar3 + bVar1;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x10);
    putchar(10);
    __k = createHuffCode(local_48,uVar3);
    local_68 = __k;
    if (uVar3 != 0) {
      uVar8 = local_50 >> 4;
      iVar2 = (int)local_58;
      uVar7 = (ulong)uVar3;
      do {
        fread(&local_6e,1,1,local_60);
        bVar1 = local_6e;
        uVar5 = (ulong)local_6e;
        pbVar4 = std::
                 map<std::pair<unsigned_char,_unsigned_int>,_unsigned_char,_std::less<std::pair<unsigned_char,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_char,_unsigned_int>,_unsigned_char>_>_>
                 ::operator[]((map<std::pair<unsigned_char,_unsigned_int>,_unsigned_char,_std::less<std::pair<unsigned_char,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_char,_unsigned_int>,_unsigned_char>_>_>
                               *)(&huffTable[0][0]._M_t._M_impl.field_0x0 +
                                 (ulong)(((uint)uVar8 & 0xfffffff) * 0x60) +
                                 (ulong)(uint)(iVar2 * 0x30)),__k);
        *pbVar4 = bVar1;
        printf("%d %d: %d\n",(ulong)__k->first,(ulong)__k->second,uVar5);
        __k = __k + 1;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
    free(local_68);
    f = (FILE *)local_60;
  }
  return;
}

Assistant:

void readDHT(FILE *f) {
    unsigned int len = EnterNewSection(f, "DHT");
    len -= 2;
    while (len > 0) {
        unsigned char v[1];
        fread(v, 1, 1, f);
        unsigned char DCorAC = v[0] >> 4;
        printf(DCorAC == 0 ? "DC\n" : "AC\n");
        unsigned char id = v[0] & 0x0F;
        printf("ID: %d\n", id);

        unsigned char a[16];
        fread(a, 1, 16, f);
        unsigned int number = 0;
        for (int i = 0; i < 16; i++) {
            printf("%d ", a[i]);
            number += a[i];
        }
        printf("\n");
        auto huffCode = createHuffCode(a, number);
        for (int i = 0; i < number; i++) {
            unsigned char v;
            fread(&v, 1, 1, f);
            huffTable[DCorAC][id][huffCode[i]] = v;
            printf("%d %d: %d\n", huffCode[i].first, huffCode[i].second, v);
        }
        free(huffCode);

        len -= (1 + 16 + number);
    }
}